

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall glslang::TParseContext::parserError(TParseContext *this,char *s)

{
  bool bVar1;
  int iVar2;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  TSourceLoc *pTVar3;
  
  bVar1 = ((this->super_TParseContextBase).super_TParseVersions.currentScanner)->endOfFileReached;
  iVar2 = (this->super_TParseContextBase).super_TParseVersions.numErrors;
  pTVar3 = TParseVersions::getCurrentLoc((TParseVersions *)this);
  UNRECOVERED_JUMPTABLE_00 =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  if ((bVar1 == true) && (iVar2 != 0)) {
    (*UNRECOVERED_JUMPTABLE_00)(this,pTVar3,"compilation terminated","","");
    return;
  }
  (*UNRECOVERED_JUMPTABLE_00)(this,pTVar3,"","",s,"");
  return;
}

Assistant:

void TParseContext::parserError(const char* s)
{
    if (! getScanner()->atEndOfInput() || numErrors == 0)
        error(getCurrentLoc(), "", "", s, "");
    else
        error(getCurrentLoc(), "compilation terminated", "", "");
}